

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxStaticArrayVariable::FxStaticArrayVariable
          (FxStaticArrayVariable *this,FxLocalVariableDeclaration *var,FScriptPosition *sc)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_StaticArrayVariable,sc);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00706758;
  this->Variable = (FxStaticArray *)var;
  (this->super_FxExpression).ValueType = (var->super_FxExpression).ValueType;
  return;
}

Assistant:

FxStaticArrayVariable::FxStaticArrayVariable(FxLocalVariableDeclaration *var, const FScriptPosition &sc)
	: FxExpression(EFX_StaticArrayVariable, sc)
{
	Variable = static_cast<FxStaticArray*>(var);
	ValueType = Variable->ValueType;
}